

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTree.cpp
# Opt level: O1

void __thiscall ASTree::ASTree(ASTree *this)

{
  allocator_type local_11;
  
  std::vector<ASTree_*,_std::allocator<ASTree_*>_>::vector
            (&this->subtrees,(initializer_list<ASTree_*>)ZEXT816(0),&local_11);
  (this->root)._M_dataplus._M_p = (pointer)&(this->root).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->root,"");
  this->parent = (ASTree *)0x0;
  return;
}

Assistant:

ASTree::ASTree() : root(""), parent(nullptr), subtrees({}) {

}